

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O3

int main(void)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  void *pvVar4;
  void *ptr;
  slab_arena *psVar5;
  FILE *__stream;
  byte *pbVar6;
  byte *pbVar7;
  byte bVar8;
  uint uVar9;
  ulong extraout_RDX;
  slab_arena *arena_00;
  uint32_t *puVar10;
  char *pcVar11;
  size_t size;
  slab_arena *psVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  uint flags;
  ulong uVar16;
  slab_arena *arena_01;
  byte bStack_4b0;
  undefined7 uStack_4af;
  char cStack_4a8;
  undefined8 uStack_a8;
  slab_arena *psStack_a0;
  slab_arena *psStack_98;
  undefined8 uStack_90;
  char *pcStack_88;
  slab_arena *psStack_80;
  undefined *puStack_78;
  code *pcStack_70;
  undefined1 local_68 [8];
  slab_arena arena;
  quota quota;
  
  pcStack_70 = (code *)0x101607;
  plan(2);
  pcStack_70 = (code *)0x101619;
  _space(_stdout);
  pcStack_70 = (code *)0x101631;
  printf("# *** %s ***\n","main");
  pcStack_70 = (code *)0x10163b;
  plan(0x12);
  pcStack_70 = (code *)0x101643;
  _space(_stdout);
  pcStack_70 = (code *)0x101654;
  printf("# *** %s ***\n","slab_test_basic");
  arena.slab_size = 0;
  arena.flags = 0;
  pcStack_70 = (code *)0x101678;
  slab_arena_create((slab_arena *)local_68,(quota *)&arena.slab_size,0,0,2);
  pcStack_70 = (code *)0x1016b0;
  _ok((uint)(arena.arena == (void *)0x0),"arena.prealloc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xb9,
      "line %d",0xb9);
  pcStack_70 = (code *)0x1016dc;
  _ok((uint)(arena.flags == 0),"quota_total(&quota) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xba,
      "line %d",0xba);
  pcStack_70 = (code *)0x101709;
  _ok((uint)(arena.prealloc == 0),"arena.used == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xbb,
      "line %d",0xbb);
  pcStack_70 = (code *)0x10173a;
  _ok((uint)((int)arena.quota == 0x10000),"arena.slab_size == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xbc,
      "line %d",0xbc);
  pcStack_70 = (code *)0x101742;
  slab_arena_destroy((slab_arena *)local_68);
  arena.slab_size = 0;
  arena.flags = 0x40;
  pcStack_70 = (code *)0x10176a;
  slab_arena_create((slab_arena *)local_68,(quota *)&arena.slab_size,1,1,2);
  pcStack_70 = (code *)0x101798;
  _ok((uint)(arena.arena == (void *)0x10000),"arena.prealloc == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xc3,
      "line %d",0xc3);
  pcStack_70 = (code *)0x1017c2;
  _ok((uint)(arena.flags == 0x40),"quota_total(&quota) == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xc4,
      "line %d",0xc4);
  pcStack_70 = (code *)0x1017ec;
  _ok((uint)(arena.prealloc == 0),"arena.used == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xc5,
      "line %d",0xc5);
  pcStack_70 = (code *)0x101816;
  _ok((uint)((int)arena.quota == 0x10000),"arena.slab_size == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xc6,
      "line %d",0xc6);
  pcStack_70 = (code *)0x10181e;
  pvVar4 = slab_map((slab_arena *)local_68);
  pcStack_70 = (code *)0x101849;
  _ok((uint)(pvVar4 != (void *)0x0),"ptr != NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",200,
      "line %d",200);
  pcStack_70 = (code *)0x101877;
  _ok((uint)(arena.prealloc == 0x10000),"arena.used == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xc9,
      "line %d",0xc9);
  pcStack_70 = (code *)0x10187f;
  ptr = slab_map((slab_arena *)local_68);
  pcStack_70 = (code *)0x1018aa;
  _ok((uint)(ptr == (void *)0x0),"ptr1 == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xcb,
      "line %d",0xcb);
  pcStack_70 = (code *)0x1018d8;
  _ok((uint)(arena.prealloc == 0x10000),"arena.used == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xcc,
      "line %d",0xcc);
  pcStack_70 = (code *)0x1018e3;
  slab_unmap((slab_arena *)local_68,pvVar4);
  pcStack_70 = (code *)0x101914;
  _ok((uint)(arena.prealloc == 0x10000),"arena.used == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xce,
      "line %d",0xce);
  pcStack_70 = (code *)0x10191f;
  slab_unmap((slab_arena *)local_68,ptr);
  pcStack_70 = (code *)0x101949;
  _ok((uint)(arena.prealloc == 0x10000),"arena.used == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xd0,
      "line %d",0xd0);
  pcStack_70 = (code *)0x101951;
  slab_arena_destroy((slab_arena *)local_68);
  arena_01 = (slab_arena *)0x7a200000000;
  arena.slab_size = 0;
  arena.flags = 0x7a2;
  pcStack_70 = (code *)0x101980;
  slab_arena_create((slab_arena *)local_68,(quota *)&arena.slab_size,3000000,1,2);
  pcStack_70 = (code *)0x1019ad;
  _ok((uint)(arena.arena == (void *)0x1f0000),"arena.prealloc == 2031616",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xd6,
      "line %d",0xd6);
  pcStack_70 = (code *)0x1019d9;
  _ok((uint)(arena.flags == 0x7a2),"quota_total(&quota) == 2000896",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xd7,
      "line %d",0xd7);
  pcStack_70 = (code *)0x101a03;
  _ok((uint)(arena.prealloc == 0),"arena.used == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xd8,
      "line %d",0xd8);
  pcStack_70 = (code *)0x101a31;
  _ok((uint)((int)arena.quota == 0x10000),"arena.slab_size == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xd9,
      "line %d",0xd9);
  pcStack_70 = (code *)0x101a40;
  slab_arena_destroy((slab_arena *)local_68);
  pcStack_70 = (code *)0x101a48;
  _space(_stdout);
  pcStack_70 = (code *)0x101a5d;
  printf("# *** %s: done ***\n","slab_test_basic");
  pcStack_70 = (code *)0x101a62;
  check_plan();
  pcStack_70 = (code *)0x101a6c;
  plan(1);
  pcStack_70 = (code *)0x101a74;
  _space(_stdout);
  pcStack_70 = (code *)0x101a89;
  printf("# *** %s ***\n");
  pcStack_70 = (code *)0x101a97;
  iVar3 = access("/proc/self/smaps",0);
  if (iVar3 != 0) {
LAB_00101b53:
    pcStack_70 = (code *)0x101b7f;
    _ok(1,"true",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0x7b
        ,"line %d",0x7b);
    pcStack_70 = (code *)0x101b87;
    _space(_stdout);
    pcStack_70 = (code *)0x101b9f;
    printf("# *** %s: done ***\n","slab_test_madvise");
    pcStack_70 = (code *)0x101ba4;
    check_plan();
    pcStack_70 = (code *)0x101bac;
    _space(_stdout);
    pcStack_70 = (code *)0x101bbd;
    printf("# *** %s: done ***\n","main");
    pcStack_70 = (code *)0x101bc2;
    iVar3 = check_plan();
    return iVar3;
  }
  puVar10 = &arena.slab_size;
  arena.slab_size = 0;
  arena.flags = 0x7a2;
  arena_00 = (slab_arena *)local_68;
  uVar9 = 1;
  uVar16 = 0x80000005;
  pcStack_70 = (code *)0x101ac5;
  slab_arena_create(arena_00,(quota *)puVar10,3000000,1,-0x7ffffffb);
  pcStack_70 = (code *)0x101acd;
  psVar12 = arena_00;
  psVar5 = (slab_arena *)slab_map(arena_00);
  if (psVar5 == (slab_arena *)0x0) {
    pcStack_70 = (code *)0x101bd6;
    main_cold_4();
LAB_00101bd6:
    pcStack_70 = (code *)0x101bdb;
    main_cold_1();
LAB_00101bdb:
    psVar5 = arena_00;
    pcStack_70 = (code *)0x101be0;
    main_cold_3();
  }
  else {
    pcStack_70 = (code *)0x101ae1;
    psVar12 = psVar5;
    _Var2 = vma_has_flag((unsigned_long)psVar5,(char *)puVar10);
    arena_00 = psVar5;
    if (!_Var2) goto LAB_00101bd6;
    arena_01 = (slab_arena *)local_68;
    pcStack_70 = (code *)0x101af8;
    slab_unmap(arena_01,psVar5);
    pcStack_70 = (code *)0x101b00;
    slab_arena_destroy(arena_01);
    puVar10 = &arena.slab_size;
    arena.slab_size = 0;
    arena.flags = 0x7a2;
    uVar9 = 0x10000;
    uVar16 = 0x80000005;
    pcStack_70 = (code *)0x101b1c;
    slab_arena_create(arena_01,(quota *)puVar10,0,0x10000,-0x7ffffffb);
    pcStack_70 = (code *)0x101b24;
    psVar12 = arena_01;
    psVar5 = (slab_arena *)slab_map(arena_01);
    if (psVar5 == (slab_arena *)0x0) goto LAB_00101bdb;
    pcStack_70 = (code *)0x101b38;
    psVar12 = psVar5;
    _Var2 = vma_has_flag((unsigned_long)psVar5,(char *)puVar10);
    if (_Var2) {
      pcStack_70 = (code *)0x101b4b;
      slab_unmap(arena_01,psVar5);
      pcStack_70 = (code *)0x101b53;
      slab_arena_destroy(arena_01);
      goto LAB_00101b53;
    }
  }
  pcStack_70 = vma_has_flag;
  main_cold_2();
  puStack_78 = &stdout;
  pcStack_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c";
  uStack_90 = 0x7a200000000;
  psStack_a0 = (slab_arena *)0x0;
  uStack_a8 = 0;
  pcVar13 = "/proc/self/smaps";
  pcVar11 = "r";
  psStack_98 = psVar5;
  psStack_80 = arena_01;
  pcStack_70 = (code *)&stack0xfffffffffffffff8;
  __stream = fopen("/proc/self/smaps","r");
  if (__stream == (FILE *)0x0) {
    vma_has_flag_cold_1();
    flags = (uint)uVar16;
    uVar14 = 0x10000;
    if (0x10000 < uVar9) {
      uVar14 = (ulong)uVar9;
    }
    lVar1 = 0x3f;
    if (uVar14 - 1 != 0) {
      for (; uVar14 - 1 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar15 = 1L << (-((byte)lVar1 ^ 0x3f) & 0x3f);
    pcVar13[0] = '\0';
    pcVar13[1] = '\0';
    pcVar13[2] = '\0';
    pcVar13[3] = '\0';
    pcVar13[4] = '\0';
    pcVar13[5] = '\0';
    pcVar13[6] = '\0';
    pcVar13[7] = '\0';
    *(int *)(pcVar13 + 0x28) = (int)uVar15;
    *(char **)(pcVar13 + 0x20) = pcVar11;
    uVar14 = (ulong)*(uint *)(pcVar11 + 4) << 10;
    if (extraout_RDX <= uVar14) {
      uVar14 = extraout_RDX;
    }
    uVar15 = uVar15 & 0xffffffff;
    uVar14 = -uVar15 & (uVar14 + uVar15) - 1;
    *(ulong *)(pcVar13 + 0x10) = uVar14;
    pcVar13[0x18] = '\0';
    pcVar13[0x19] = '\0';
    pcVar13[0x1a] = '\0';
    pcVar13[0x1b] = '\0';
    pcVar13[0x1c] = '\0';
    pcVar13[0x1d] = '\0';
    pcVar13[0x1e] = '\0';
    pcVar13[0x1f] = '\0';
    if ((int)flags < 0) {
      if ((~flags & 0x80000002) != 0 && (~flags & 0x80000001) != 0) {
        __assert_fail("IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_PRIVATE) || IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_SHARED)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                      ,0xad,"void slab_arena_flags_init(struct slab_arena *, int)");
      }
      *(uint *)(pcVar13 + 0x2c) = flags;
    }
    else {
      if ((uVar16 & 3) == 0) {
        __assert_fail("flags & (MAP_PRIVATE | MAP_SHARED)",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                      ,0xa4,"void slab_arena_flags_init(struct slab_arena *, int)");
      }
      if (flags == 2) {
        pcVar13[0x2c] = '\x01';
        pcVar13[0x2d] = '\0';
        pcVar13[0x2e] = '\0';
        pcVar13[0x2f] = -0x80;
        flags = 0x80000001;
      }
      else {
        pcVar13[0x2c] = '\x02';
        pcVar13[0x2d] = '\0';
        pcVar13[0x2e] = '\0';
        pcVar13[0x2f] = -0x80;
        flags = 0x80000002;
      }
    }
    iVar3 = 0;
    if (uVar14 == 0) {
      size = 0;
      pvVar4 = (void *)0x0;
    }
    else {
      pvVar4 = mmap_checked(uVar14,uVar15,flags);
      size = *(size_t *)(pcVar13 + 0x10);
      flags = *(uint *)(pcVar13 + 0x2c);
    }
    *(void **)(pcVar13 + 8) = pvVar4;
    madvise_checked(pvVar4,size,flags);
    if (*(long *)(pcVar13 + 0x10) != 0) {
      iVar3 = -(uint)(*(long *)(pcVar13 + 8) == 0);
    }
    return iVar3;
  }
  pcVar11 = fgets((char *)&bStack_4b0,0x400,__stream);
  if (pcVar11 != (char *)0x0) {
    do {
      if (bStack_4b0 != 0) {
        pbVar6 = (byte *)&uStack_4af;
        pbVar7 = (byte *)&uStack_4af;
        bVar8 = bStack_4b0;
        do {
          pbVar6 = pbVar6 + 1;
          if (9 < (byte)(bVar8 - 0x30)) {
            uVar9 = bVar8 - 0x2d;
            if (0x39 < uVar9) break;
            if ((0x3f0000003f00000U >> ((ulong)uVar9 & 0x3f) & 1) == 0) {
              if ((ulong)uVar9 == 0) {
                bVar8 = *pbVar7;
                goto LAB_00101cdc;
              }
              break;
            }
          }
          bVar8 = *pbVar7;
          pbVar7 = pbVar7 + 1;
        } while (bVar8 != 0);
      }
LAB_00101c9b:
      if ((cStack_4a8 == ' ' && CONCAT71(uStack_4af,bStack_4b0) == 0x3a7367616c466d56) &&
         (psStack_a0 == psVar12)) {
        pcVar11 = strtok((char *)&bStack_4b0," \n");
        if (pcVar11 != (char *)0x0) goto LAB_00101d49;
        break;
      }
LAB_00101cbb:
      pcVar11 = fgets((char *)&bStack_4b0,0x400,__stream);
    } while (pcVar11 != (char *)0x0);
  }
  iVar3 = 0;
LAB_00101d71:
  fclose(__stream);
  return iVar3;
LAB_00101cdc:
  if (bVar8 == 0) goto LAB_00101c9b;
  if ((9 < (byte)(bVar8 - 0x30)) &&
     ((0x25 < bVar8 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar8 - 0x41) & 0x3f) & 1) == 0)))) {
    if (bVar8 == 0x20) {
      __isoc99_sscanf(&bStack_4b0,"%lx-%lx",&psStack_a0,&uStack_a8);
      goto LAB_00101cbb;
    }
    goto LAB_00101c9b;
  }
  bVar8 = *pbVar6;
  pbVar6 = pbVar6 + 1;
  goto LAB_00101cdc;
  while( true ) {
    psVar12 = (slab_arena *)0x0;
    iVar3 = 0;
    pcVar11 = strtok((char *)0x0," \n");
    if (pcVar11 == (char *)0x0) break;
LAB_00101d49:
    if (((*pcVar11 == 'd') && (pcVar11[1] == 'd')) && (pcVar11[2] == '\0')) {
      iVar3 = (int)CONCAT71((int7)((ulong)psVar12 >> 8),1);
      break;
    }
  }
  goto LAB_00101d71;
}

Assistant:

int
main(void)
{
	plan(2);
	header();

	slab_test_basic();
#ifdef ENABLE_ASAN
	slab_test_membership();
#else
	slab_test_madvise();
#endif

	footer();
	return check_plan();
}